

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

bool basist::transcode_uastc_to_bc1(uastc_block *src_blk,void *pDst,bool high_quality)

{
  unpacked_uastc_block *puVar1;
  bool bVar2;
  byte in_DL;
  bool in_stack_0000000e;
  bool in_stack_0000000f;
  unpacked_uastc_block *in_stack_00000010;
  uastc_block *in_stack_00000018;
  bool unpack_srgb;
  color32 block_pixels [4] [4];
  uint32_t mode;
  unpacked_uastc_block unpacked_src_blk;
  unpacked_uastc_block *unpacked_blk;
  unpacked_uastc_block *local_108;
  uint32_t in_stack_ffffffffffffff04;
  uint32_t in_stack_ffffffffffffff08;
  uint32_t in_stack_ffffffffffffff0c;
  void *in_stack_ffffffffffffff10;
  uint8_t in_stack_ffffffffffffff1f;
  void *in_stack_ffffffffffffff20;
  color32 (*in_stack_ffffffffffffff28) [4];
  unpacked_uastc_block *in_stack_ffffffffffffff30;
  void *in_stack_ffffffffffffff78;
  unpacked_uastc_block *in_stack_ffffffffffffff80;
  uint32_t local_4c;
  byte local_40;
  byte local_3f;
  bool local_1;
  
  unpacked_uastc_block::unpacked_uastc_block((unpacked_uastc_block *)0x1afadc);
  bVar2 = unpack_uastc(in_stack_00000018,in_stack_00000010,in_stack_0000000f,in_stack_0000000e);
  if (bVar2) {
    if (local_4c == 8) {
      encode_bc1_solid_block
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,
                 in_stack_ffffffffffffff04);
      local_1 = true;
    }
    else {
      if (((in_DL & 1) == 0) && ((local_40 & 1) != 0)) {
        transcode_uastc_to_bc1_hint0(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
      else {
        unpacked_blk = (unpacked_uastc_block *)&stack0xffffffffffffff48;
        puVar1 = (unpacked_uastc_block *)&stack0xffffffffffffff08;
        do {
          local_108 = puVar1;
          color32::color32((color32 *)local_108);
          puVar1 = (unpacked_uastc_block *)
                   ((anon_union_4_3_898e29d3_for_color32_0 *)&local_108->m_astc + 1);
        } while ((unpacked_uastc_block *)
                 ((anon_union_4_3_898e29d3_for_color32_0 *)&local_108->m_astc + 1) != unpacked_blk);
        bVar2 = unpack_uastc(unpacked_blk,(color32 *)local_108,false);
        if (!bVar2) {
          return false;
        }
        if ((local_3f & 1) == 0) {
          encode_bc1((void *)unpacked_src_blk.m_astc.m_weights._5_8_,
                     (uint8_t *)unpacked_src_blk.m_astc._36_8_,
                     unpacked_src_blk.m_astc.m_endpoints._11_4_);
        }
        else {
          transcode_uastc_to_bc1_hint1
                    (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                     (bool)in_stack_ffffffffffffff1f);
        }
      }
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool transcode_uastc_to_bc1(const uastc_block& src_blk, void* pDst, bool high_quality)
	{
		unpacked_uastc_block unpacked_src_blk;
		if (!unpack_uastc(src_blk, unpacked_src_blk, false))
			return false;

		const uint32_t mode = unpacked_src_blk.m_mode;

		if (mode == UASTC_MODE_INDEX_SOLID_COLOR)
		{
			encode_bc1_solid_block(pDst, unpacked_src_blk.m_solid_color.r, unpacked_src_blk.m_solid_color.g, unpacked_src_blk.m_solid_color.b);
			return true;
		}

		if ((!high_quality) && (unpacked_src_blk.m_bc1_hint0))
			transcode_uastc_to_bc1_hint0(unpacked_src_blk, pDst);
		else
		{
			color32 block_pixels[4][4];
			const bool unpack_srgb = false;
			if (!unpack_uastc(unpacked_src_blk, &block_pixels[0][0], unpack_srgb))
				return false;

			if (unpacked_src_blk.m_bc1_hint1)
				transcode_uastc_to_bc1_hint1(unpacked_src_blk, block_pixels, pDst, high_quality);
			else
				encode_bc1(pDst, &block_pixels[0][0].r, high_quality ? cEncodeBC1HighQuality : 0);
		}

		return true;
	}